

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkPrimal.cpp
# Opt level: O1

void __thiscall HEkkPrimal::basicFeasibilityChangeBtran(HEkkPrimal *this)

{
  int iVar1;
  
  HighsSimplexAnalysis::simplexTimerStart(this->analysis,0x3d,0);
  iVar1 = (this->ekk_instance_->lp_).num_row_;
  if (this->analysis->analyse_simplex_summary_data == true) {
    HighsSimplexAnalysis::operationRecordBefore
              (this->analysis,2,&this->col_basic_feasibility_change,
               (this->ekk_instance_->info_).col_basic_feasibility_change_density);
  }
  HSimplexNla::btran(&this->ekk_instance_->simplex_nla_,&this->col_basic_feasibility_change,
                     (this->ekk_instance_->info_).col_basic_feasibility_change_density,
                     this->analysis->pointer_serial_factor_clocks);
  if (this->analysis->analyse_simplex_summary_data == true) {
    HighsSimplexAnalysis::operationRecordAfter(this->analysis,2,&this->col_basic_feasibility_change)
    ;
  }
  HEkk::updateOperationResultDensity
            (this->ekk_instance_,(double)(this->col_basic_feasibility_change).count / (double)iVar1,
             &(this->ekk_instance_->info_).col_basic_feasibility_change_density);
  HighsSimplexAnalysis::simplexTimerStop(this->analysis,0x3d,0);
  return;
}

Assistant:

void HEkkPrimal::basicFeasibilityChangeBtran() {
  // Performs BTRAN on col_basic_feasibility_change. Make sure that
  // col_basic_feasibility_change.count is large (>lp_.num_row_ to be
  // sure) rather than 0 if the indices of the RHS (and true value of
  // col_basic_feasibility_change.count) isn't known.
  analysis->simplexTimerStart(BtranBasicFeasibilityChangeClock);
  const HighsInt solver_num_row = ekk_instance_.lp_.num_row_;
  if (analysis->analyse_simplex_summary_data)
    analysis->operationRecordBefore(
        kSimplexNlaBtranBasicFeasibilityChange, col_basic_feasibility_change,
        ekk_instance_.info_.col_basic_feasibility_change_density);
  ekk_instance_.simplex_nla_.btran(
      col_basic_feasibility_change,
      ekk_instance_.info_.col_basic_feasibility_change_density,
      analysis->pointer_serial_factor_clocks);

  if (analysis->analyse_simplex_summary_data)
    analysis->operationRecordAfter(kSimplexNlaBtranBasicFeasibilityChange,
                                   col_basic_feasibility_change);
  const double local_col_basic_feasibility_change_density =
      (double)col_basic_feasibility_change.count / solver_num_row;
  ekk_instance_.updateOperationResultDensity(
      local_col_basic_feasibility_change_density,
      ekk_instance_.info_.col_basic_feasibility_change_density);
  analysis->simplexTimerStop(BtranBasicFeasibilityChangeClock);
}